

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

double __thiscall cvm::BasicValue::toDouble(BasicValue *this)

{
  char *pcVar1;
  allocator local_39;
  string local_38;
  BasicValue *local_18;
  BasicValue *this_local;
  
  switch(this->Type) {
  case BoolType:
    this_local = (BasicValue *)(double)((this->field_2).BoolVal & 1);
    break;
  case IntType:
    this_local = (BasicValue *)(double)(this->field_2).IntVal;
    break;
  case DoubleType:
    this_local = *(BasicValue **)&this->field_2;
    break;
  case StringType:
    local_18 = this;
    pcVar1 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
    this_local = (BasicValue *)std::__cxx11::stod(&local_38,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    break;
  default:
    this_local = (BasicValue *)0x0;
  }
  return (double)this_local;
}

Assistant:

double BasicValue::toDouble() const {
  switch (Type) {
  default:          return 0.0;
  case IntType:     return static_cast<double>(IntVal);
  case DoubleType:  return DoubleVal;
  case BoolType:    return static_cast<double>(BoolVal);
  case StringType:  return std::stod(StrVal.c_str());
  }
}